

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O0

uint32_t __thiscall spvtools::opt::InstrumentPass::GetVoidId(InstrumentPass *this)

{
  uint32_t uVar1;
  IRContext *this_00;
  Type *type;
  Type *reg_void_ty;
  Void void_ty;
  TypeManager *type_mgr;
  InstrumentPass *this_local;
  
  if (this->void_id_ == 0) {
    this_00 = Pass::context(&this->super_Pass);
    void_ty.super_Type._32_8_ = IRContext::get_type_mgr(this_00);
    analysis::Void::Void((Void *)&reg_void_ty);
    type = analysis::TypeManager::GetRegisteredType
                     ((TypeManager *)void_ty.super_Type._32_8_,(Type *)&reg_void_ty);
    uVar1 = analysis::TypeManager::GetTypeInstruction((TypeManager *)void_ty.super_Type._32_8_,type)
    ;
    this->void_id_ = uVar1;
    analysis::Void::~Void((Void *)&reg_void_ty);
  }
  return this->void_id_;
}

Assistant:

uint32_t InstrumentPass::GetVoidId() {
  if (void_id_ == 0) {
    analysis::TypeManager* type_mgr = context()->get_type_mgr();
    analysis::Void void_ty;
    analysis::Type* reg_void_ty = type_mgr->GetRegisteredType(&void_ty);
    void_id_ = type_mgr->GetTypeInstruction(reg_void_ty);
  }
  return void_id_;
}